

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonObject.h
# Opt level: O3

bool __thiscall Json::JsonObject::put(JsonObject *this,string *jsonKey,int jsonValue)

{
  bool bVar1;
  JsonString *this_00;
  JsonValue *jsonValue_00;
  
  bVar1 = find_and_throw_exception(this,jsonKey);
  if (bVar1) {
    return false;
  }
  this_00 = (JsonString *)operator_new(0x48);
  JsonString::JsonString(this_00,jsonKey);
  jsonValue_00 = (JsonValue *)operator_new(0x38);
  (jsonValue_00->__vcsp).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (jsonValue_00->__vcsp).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (jsonValue_00->__vcsp).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  jsonValue_00->_vptr_JsonValue = (_func_int **)&PTR_type_00112990;
  *(int *)&jsonValue_00[1]._vptr_JsonValue = jsonValue;
  *(undefined1 *)
   &jsonValue_00[1].__vcsp.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = 1;
  bVar1 = put(this,this_00,jsonValue_00);
  return bVar1;
}

Assistant:

bool put(const std::string &jsonKey, int jsonValue) {
            if (find_and_throw_exception(jsonKey))return false;
            return put(new JsonString(jsonKey), new JsonNumber(jsonValue));
        }